

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall FTOutline::convert(FTOutline *this,VPath *path)

{
  bool bVar1;
  reference pEVar2;
  FTOutline *this_00;
  int __fd;
  VPointF in_RDI;
  Element element;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *__range1;
  size_t index;
  vector<VPointF,_std::allocator<VPointF>_> *points;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *elements;
  const_reference in_stack_ffffffffffffff88;
  FTOutline *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Element *local_40;
  __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
  local_38;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *local_30;
  size_type local_28;
  vector<VPointF,_std::allocator<VPointF>_> *local_20;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *local_18;
  
  local_18 = VPath::elements((VPath *)0x131a82);
  local_20 = VPath::points((VPath *)0x131a91);
  std::vector<VPointF,_std::allocator<VPointF>_>::size(local_20);
  VPath::segments((VPath *)0x131aaf);
  grow((FTOutline *)in_RDI,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
  local_28 = 0;
  local_30 = local_18;
  local_38._M_current =
       (Element *)
       std::vector<VPath::Element,_std::allocator<VPath::Element>_>::begin
                 ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)
                  in_stack_ffffffffffffff88);
  local_40 = (Element *)
             std::vector<VPath::Element,_std::allocator<VPath::Element>_>::end
                       ((vector<VPath::Element,_std::allocator<VPath::Element>_> *)
                        in_stack_ffffffffffffff88);
  while( true ) {
    __fd = (int)&local_40;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
             ::operator*(&local_38);
    this_00 = (FTOutline *)(ulong)*pEVar2;
    switch(this_00) {
    case (FTOutline *)0x0:
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_20,local_28);
      moveTo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_28 = local_28 + 1;
      break;
    case (FTOutline *)0x1:
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_20,local_28);
      lineTo(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_28 = local_28 + 1;
      break;
    case (FTOutline *)0x2:
      in_stack_ffffffffffffff88 =
           std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_20,local_28);
      in_stack_ffffffffffffff90 =
           (FTOutline *)
           std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_20,local_28 + 1);
      std::vector<VPointF,_std::allocator<VPointF>_>::operator[](local_20,local_28 + 2);
      cubicTo(this_00,(VPointF *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RDI);
      local_28 = local_28 + 3;
      break;
    case (FTOutline *)0x3:
      close((FTOutline *)in_RDI,__fd);
    }
    __gnu_cxx::
    __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
    ::operator++(&local_38);
  }
  end((FTOutline *)in_RDI);
  return;
}

Assistant:

void FTOutline::convert(const VPath &path)
{
    const std::vector<VPath::Element> &elements = path.elements();
    const std::vector<VPointF> &       points = path.points();

    grow(points.size(), path.segments());

    size_t index = 0;
    for (auto element : elements) {
        switch (element) {
        case VPath::Element::MoveTo:
            moveTo(points[index]);
            index++;
            break;
        case VPath::Element::LineTo:
            lineTo(points[index]);
            index++;
            break;
        case VPath::Element::CubicTo:
            cubicTo(points[index], points[index + 1], points[index + 2]);
            index = index + 3;
            break;
        case VPath::Element::Close:
            close();
            break;
        }
    }
    end();
}